

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O0

array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> * __thiscall
jhu::thrax::fields(array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>
                   *__return_storage_ptr__,thrax *this,string_view line)

{
  size_type sVar1;
  invalid_argument *piVar2;
  reference pvVar3;
  size_type __pos;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  size_t local_68;
  char *local_60;
  size_t local_58;
  char *local_50;
  size_type start;
  char *local_38;
  size_type tabPos;
  string_view line_local;
  
  line_local._M_len = line._M_len;
  tabPos = (size_type)this;
  std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::array
            (__return_storage_ptr__);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&tabPos,'\t',0);
  if (sVar1 == 0xffffffffffffffff) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"not enough fields");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&tabPos,0,sVar1);
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::operator[]
                     (__return_storage_ptr__,0);
  start = bVar4._M_len;
  pvVar3->_M_len = start;
  local_38 = bVar4._M_str;
  pvVar3->_M_str = local_38;
  __pos = sVar1 + 1;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&tabPos,'\t',__pos);
  if (sVar1 == 0xffffffffffffffff) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"not enough fields");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&tabPos,__pos,sVar1 - __pos
                    );
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::operator[]
                     (__return_storage_ptr__,1);
  local_58 = bVar4._M_len;
  pvVar3->_M_len = local_58;
  local_50 = bVar4._M_str;
  pvVar3->_M_str = local_50;
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&tabPos,sVar1 + 1,
                     0xffffffffffffffff);
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::operator[]
                     (__return_storage_ptr__,2);
  local_68 = bVar4._M_len;
  pvVar3->_M_len = local_68;
  local_60 = bVar4._M_str;
  pvVar3->_M_str = local_60;
  return __return_storage_ptr__;
}

Assistant:

inline auto fields(std::string_view line) {
  std::array<std::string_view, 3> result;
  auto tabPos = line.find('\t');
  if (tabPos == std::string_view::npos) {
    throw std::invalid_argument("not enough fields");
  }
  result[0] = line.substr(0, tabPos);
  auto start = tabPos + 1;
  tabPos = line.find('\t', start);
  if (tabPos == std::string_view::npos) {
    throw std::invalid_argument("not enough fields");
  }
  result[1] = line.substr(start, tabPos - start);
  result[2] = line.substr(tabPos + 1);
  return result;
}